

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# creation_set.c
# Opt level: O2

int cset_read_support_filter_program(creation_set *cset,archive *a)

{
  int iVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = 8;
  iVar1 = 0;
  for (lVar3 = 0; lVar3 < cset->filter_count; lVar3 = lVar3 + 1) {
    if (*(int *)((long)cset->filters + lVar2 + -8) != 0) {
      archive_read_support_filter_program(a,*(char **)((long)&cset->filters->program + lVar2));
      iVar1 = iVar1 + 1;
    }
    lVar2 = lVar2 + 0x10;
  }
  return iVar1;
}

Assistant:

int
cset_read_support_filter_program(struct creation_set *cset, struct archive *a)
{
	int cnt = 0, i;

	for (i = 0; i < cset->filter_count; i++) {
		if (cset->filters[i].program) {
			archive_read_support_filter_program(a,
			    cset->filters[i].filter_name);
			++cnt;
		}
	}
	return (cnt);
}